

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bus_test.c
# Opt level: O2

void test_bus_send_buf_option(void)

{
  nng_err nVar1;
  int iVar2;
  nng_err nVar3;
  char *pcVar4;
  char *pcVar5;
  int local_40;
  nng_socket local_3c;
  int v;
  nng_socket s2;
  _Bool b;
  nng_socket s1;
  
  nVar1 = nng_bus0_open(&s2);
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                         ,0x165,"%s: expected success, got %s (%d)","nng_bus0_open(&s1)",pcVar4,
                         nVar1);
  if (iVar2 != 0) {
    nVar1 = nng_bus0_open(&local_3c);
    pcVar4 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                           ,0x166,"%s: expected success, got %s (%d)","nng_bus0_open(&s2)",pcVar4,
                           nVar1);
    if (iVar2 != 0) {
      nVar1 = nuts_marry(s2,local_3c);
      pcVar4 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                             ,0x167,"%s: expected success, got %s (%d)","nuts_marry(s1, s2)",pcVar4,
                             nVar1);
      if (iVar2 != 0) {
        nVar1 = nng_socket_set_int(s2,"send-buffer",1);
        pcVar4 = nng_strerror(nVar1);
        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                               ,0x169,"%s: expected success, got %s (%d)",
                               "nng_socket_set_int(s1, opt, 1)",pcVar4,nVar1);
        if (iVar2 != 0) {
          nVar3 = nng_socket_set_int(s2,"send-buffer",0);
          pcVar4 = nng_strerror(NNG_EINVAL);
          acutest_check_((uint)(nVar3 == NNG_EINVAL),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                         ,0x16a,"%s fails with %s","nng_socket_set_int(s1, opt, 0)",pcVar4,nVar1);
          pcVar4 = nng_strerror(NNG_EINVAL);
          pcVar5 = nng_strerror(nVar3);
          acutest_message_("%s: expected %s (%d), got %s (%d)","nng_socket_set_int(s1, opt, 0)",
                           pcVar4,3,pcVar5,(ulong)nVar3);
          nVar1 = nng_socket_set_int(s2,"send-buffer",-1);
          pcVar4 = nng_strerror(NNG_EINVAL);
          acutest_check_((uint)(nVar1 == NNG_EINVAL),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                         ,0x16b,"%s fails with %s","nng_socket_set_int(s1, opt, -1)",pcVar4);
          pcVar4 = nng_strerror(NNG_EINVAL);
          pcVar5 = nng_strerror(nVar1);
          acutest_message_("%s: expected %s (%d), got %s (%d)","nng_socket_set_int(s1, opt, -1)",
                           pcVar4,3,pcVar5,(ulong)nVar1);
          nVar1 = nng_socket_set_int(s2,"send-buffer",1000000);
          pcVar4 = nng_strerror(NNG_EINVAL);
          acutest_check_((uint)(nVar1 == NNG_EINVAL),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                         ,0x16c,"%s fails with %s","nng_socket_set_int(s1, opt, 1000000)",pcVar4);
          pcVar4 = nng_strerror(NNG_EINVAL);
          pcVar5 = nng_strerror(nVar1);
          acutest_message_("%s: expected %s (%d), got %s (%d)",
                           "nng_socket_set_int(s1, opt, 1000000)",pcVar4,3,pcVar5,(ulong)nVar1);
          nVar1 = nng_socket_set_int(s2,"send-buffer",3);
          pcVar4 = nng_strerror(nVar1);
          iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                                 ,0x16d,"%s: expected success, got %s (%d)",
                                 "nng_socket_set_int(s1, opt, 3)",pcVar4,nVar1);
          if (iVar2 != 0) {
            nVar1 = nng_socket_get_int(s2,"send-buffer",&local_40);
            pcVar4 = nng_strerror(nVar1);
            iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                                   ,0x16e,"%s: expected success, got %s (%d)",
                                   "nng_socket_get_int(s1, opt, &v)",pcVar4,nVar1);
            if (iVar2 != 0) {
              acutest_check_((uint)(local_40 == 3),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                             ,0x16f,"%s","v == 3");
              nVar3 = nng_socket_set_bool(s2,"send-buffer",true);
              pcVar4 = nng_strerror(NNG_EBADTYPE);
              acutest_check_((uint)(nVar3 == NNG_EBADTYPE),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                             ,0x170,"%s fails with %s","nng_socket_set_bool(s1, opt, true)",pcVar4,
                             nVar1);
              pcVar4 = nng_strerror(NNG_EBADTYPE);
              pcVar5 = nng_strerror(nVar3);
              acutest_message_("%s: expected %s (%d), got %s (%d)",
                               "nng_socket_set_bool(s1, opt, true)",pcVar4,0x1e,pcVar5,(ulong)nVar3)
              ;
              nVar1 = nng_socket_get_bool(s2,"send-buffer",(_Bool *)((long)&v + 3));
              pcVar4 = nng_strerror(NNG_EBADTYPE);
              acutest_check_((uint)(nVar1 == NNG_EBADTYPE),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                             ,0x171,"%s fails with %s","nng_socket_get_bool(s1, opt, &b)",pcVar4);
              pcVar4 = nng_strerror(NNG_EBADTYPE);
              pcVar5 = nng_strerror(nVar1);
              acutest_message_("%s: expected %s (%d), got %s (%d)",
                               "nng_socket_get_bool(s1, opt, &b)",pcVar4,0x1e,pcVar5,(ulong)nVar1);
              nVar1 = nng_socket_close(s2);
              pcVar4 = nng_strerror(nVar1);
              iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                                     ,0x173,"%s: expected success, got %s (%d)",
                                     "nng_socket_close(s1)",pcVar4,nVar1);
              if (iVar2 != 0) {
                nVar1 = nng_socket_close(local_3c);
                pcVar4 = nng_strerror(nVar1);
                iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                                       ,0x174,"%s: expected success, got %s (%d)",
                                       "nng_socket_close(s2)",pcVar4,nVar1);
                if (iVar2 != 0) {
                  return;
                }
              }
            }
          }
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

static void
test_bus_send_buf_option(void)
{
	nng_socket  s1;
	nng_socket  s2;
	int         v;
	bool        b;
	const char *opt = NNG_OPT_SENDBUF;

	NUTS_PASS(nng_bus0_open(&s1));
	NUTS_PASS(nng_bus0_open(&s2));
	NUTS_MARRY(s1, s2);

	NUTS_PASS(nng_socket_set_int(s1, opt, 1));
	NUTS_FAIL(nng_socket_set_int(s1, opt, 0), NNG_EINVAL);
	NUTS_FAIL(nng_socket_set_int(s1, opt, -1), NNG_EINVAL);
	NUTS_FAIL(nng_socket_set_int(s1, opt, 1000000), NNG_EINVAL);
	NUTS_PASS(nng_socket_set_int(s1, opt, 3));
	NUTS_PASS(nng_socket_get_int(s1, opt, &v));
	NUTS_TRUE(v == 3);
	NUTS_FAIL(nng_socket_set_bool(s1, opt, true), NNG_EBADTYPE);
	NUTS_FAIL(nng_socket_get_bool(s1, opt, &b), NNG_EBADTYPE);

	NUTS_CLOSE(s1);
	NUTS_CLOSE(s2);
}